

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cord_rep_flat.h
# Opt level: O1

CordRepFlat * absl::lts_20250127::cord_internal::CordRepFlat::NewImpl<4096ul>(size_t len)

{
  size_t sVar1;
  CordRepFlat *pCVar2;
  byte bVar3;
  ulong uVar4;
  ulong uVar5;
  long lVar6;
  
  sVar1 = 0xff3;
  if (len < 0xff3) {
    sVar1 = len;
  }
  uVar4 = 0x20;
  if (0x13 < len) {
    uVar4 = sVar1 + 0xd;
  }
  uVar5 = 0xffffffffffffffc0;
  lVar6 = uVar4 + 0x40;
  if (uVar4 < 0x201) {
    uVar5 = 0xfffffffffffffff8;
    lVar6 = uVar4 + 8;
  }
  uVar5 = uVar5 & lVar6 - 1U;
  pCVar2 = (CordRepFlat *)operator_new(uVar5);
  (pCVar2->super_CordRep).length = 0;
  (pCVar2->super_CordRep).refcount = (atomic<int>)0x0;
  (pCVar2->super_CordRep).tag = '\0';
  (pCVar2->super_CordRep).storage[0] = '\0';
  (pCVar2->super_CordRep).storage[1] = '\0';
  (pCVar2->super_CordRep).storage[2] = '\0';
  (pCVar2->super_CordRep).refcount.count_.super___atomic_base<int>._M_i = 2;
  bVar3 = (char)(uVar5 >> 3) + 2;
  if (0x200 < uVar5) {
    bVar3 = (char)(lVar6 - 1U >> 6) + 0x3a;
  }
  if (0xf8 < bVar3) {
    __assert_fail("tag <= MAX_FLAT_TAG",
                  "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/build_O1/_deps/absl-src/absl/strings/internal/cord_rep_flat.h"
                  ,0x5e,"uint8_t absl::cord_internal::AllocatedSizeToTag(size_t)");
  }
  (pCVar2->super_CordRep).tag = bVar3;
  return pCVar2;
}

Assistant:

static CordRepFlat* NewImpl(size_t len, Args... args ABSL_ATTRIBUTE_UNUSED) {
    if (len <= kMinFlatLength) {
      len = kMinFlatLength;
    } else if (len > max_flat_size - kFlatOverhead) {
      len = max_flat_size - kFlatOverhead;
    }

    // Round size up so it matches a size we can exactly express in a tag.
    const size_t size = RoundUpForTag(len + kFlatOverhead);
    void* const raw_rep = ::operator new(size);
    // GCC 13 has a false-positive -Wstringop-overflow warning here.
    #if ABSL_INTERNAL_HAVE_MIN_GNUC_VERSION(13, 0)
    #pragma GCC diagnostic push
    #pragma GCC diagnostic ignored "-Wstringop-overflow"
    #endif
    CordRepFlat* rep = new (raw_rep) CordRepFlat();
    rep->tag = AllocatedSizeToTag(size);
    #if ABSL_INTERNAL_HAVE_MIN_GNUC_VERSION(13, 0)
    #pragma GCC diagnostic pop
    #endif
    return rep;
  }